

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int decode_session_identifier
              (uint64_t *issued_at,ptls_iovec_t *psk,uint32_t *ticket_age_add,
              ptls_iovec_t *server_name,uint16_t *csid,uint8_t *src,uint8_t *end)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  uint *puVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  uint *end_00;
  uint *local_48;
  ptls_iovec_t *local_40;
  uint *local_38;
  
  iVar8 = 6;
  local_48 = (uint *)src;
  if (1 < (ulong)((long)end - (long)src)) {
    lVar7 = 0;
    uVar4 = 0;
    do {
      uVar4 = (ulong)src[lVar7] | uVar4 << 8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
    local_48 = (uint *)(src + 2);
    if (uVar4 <= (ulong)((long)end - (long)local_48)) {
      end_00 = (uint *)((long)local_48 + uVar4);
      local_40 = server_name;
      local_38 = ticket_age_add;
      iVar3 = decode64(issued_at,(uint8_t **)&local_48,(uint8_t *)end_00);
      if (iVar3 == 0) {
        iVar3 = 0x32;
        iVar8 = 6;
        if ((ulong)((long)end_00 - (long)local_48) < 2) {
          bVar2 = false;
        }
        else {
          lVar7 = 0;
          uVar4 = 0;
          do {
            uVar4 = (ulong)*(byte *)((long)local_48 + lVar7) | uVar4 << 8;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 2);
          local_48 = (uint *)((long)local_48 + 2);
          bVar2 = false;
          if (uVar4 <= (ulong)((long)end_00 - (long)local_48)) {
            psk->base = (uint8_t *)local_48;
            local_48 = (uint *)((long)local_48 + uVar4);
            psk->len = uVar4;
            bVar2 = true;
            iVar8 = 0;
            iVar3 = 0;
          }
        }
        if (bVar2) {
          lVar7 = (long)end_00 - (long)local_48;
          iVar3 = 0x32;
          if (1 < lVar7) {
            *csid = (ushort)*local_48 << 8 | (ushort)*local_48 >> 8;
            local_48 = (uint *)((long)local_48 + 2);
            iVar3 = 0;
          }
          iVar8 = 6;
          if ((1 < lVar7) && (iVar3 = 0x32, 3 < (long)end_00 - (long)local_48)) {
            uVar1 = *local_48;
            *local_38 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        uVar1 << 0x18;
            puVar5 = local_48 + 1;
            iVar3 = 0x32;
            iVar8 = 6;
            if ((ulong)((long)end_00 - (long)puVar5) < 2) {
              bVar2 = false;
              local_48 = puVar5;
            }
            else {
              lVar7 = 0;
              uVar4 = 0;
              do {
                uVar4 = (ulong)*(byte *)((long)puVar5 + lVar7) | uVar4 << 8;
                lVar7 = lVar7 + 1;
              } while (lVar7 != 2);
              local_48 = (uint *)((long)local_48 + 6);
              bVar2 = false;
              if (uVar4 <= (ulong)((long)end_00 - (long)local_48)) {
                local_40->base = (uint8_t *)local_48;
                local_48 = (uint *)((long)local_48 + uVar4);
                local_40->len = uVar4;
                bVar2 = true;
                iVar8 = 0;
                iVar3 = 0;
              }
            }
            if (bVar2) {
              iVar8 = 6;
              if (local_48 == end_00) {
                iVar8 = 0;
              }
              else {
                iVar3 = 0x32;
              }
            }
          }
        }
      }
      goto LAB_00105e1e;
    }
  }
  iVar3 = 0x32;
LAB_00105e1e:
  iVar6 = 0x32;
  if (local_48 == (uint *)end) {
    iVar6 = iVar3;
  }
  if (iVar8 != 0) {
    iVar6 = iVar3;
  }
  return iVar6;
}

Assistant:

int decode_session_identifier(uint64_t *issued_at, ptls_iovec_t *psk, uint32_t *ticket_age_add, ptls_iovec_t *server_name,
                              uint16_t *csid, const uint8_t *src, const uint8_t *end)
{
    int ret = 0;

    decode_block(src, end, 2, {
        if ((ret = decode64(issued_at, &src, end)) != 0)
            goto Exit;
        decode_open_block(src, end, 2, {
            *psk = ptls_iovec_init(src, end - src);
            src = end;
        });
        if ((ret = decode16(csid, &src, end)) != 0)
            goto Exit;
        if ((ret = decode32(ticket_age_add, &src, end)) != 0)
            goto Exit;
        decode_open_block(src, end, 2, {
            *server_name = ptls_iovec_init(src, end - src);
            src = end;
        });
    });

Exit:
    return ret;
}